

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# lest_cpp03.hpp
# Opt level: O0

pair<lest::options,_std::vector<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>_>
* lest::split_arguments
            (pair<lest::options,_std::vector<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>_>
             *__return_storage_ptr__,texts *args)

{
  bool bVar1;
  reference pbVar2;
  char *pcVar3;
  runtime_error *this;
  byte local_319;
  pair<lest::options,_std::vector<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>_>
  local_2a8;
  undefined1 local_271;
  char local_270 [32];
  basic_string<char,_std::char_traits<char>,_std::allocator<char>_> local_250 [32];
  runtime_error local_230 [16];
  string local_220 [39];
  allocator local_1f9;
  string local_1f8 [32];
  string local_1d8 [32];
  string local_1b8 [39];
  allocator local_191;
  string local_190 [32];
  string local_170 [36];
  undefined4 local_14c;
  basic_string<char,_std::char_traits<char>,_std::allocator<char>_> local_148 [16];
  string local_138 [32];
  pair<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>
  local_118;
  string local_c8 [8];
  text arg;
  string local_a8 [8];
  text val;
  string local_88 [8];
  text opt;
  __normal_iterator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_*,_std::vector<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>_>
  local_68;
  basic_string<char,_std::char_traits<char>,_std::allocator<char>_> *local_60;
  __normal_iterator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_*,_std::vector<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>_>
  local_58;
  iterator pos;
  undefined1 local_48 [7];
  bool in_options;
  texts in;
  options option;
  texts *args_local;
  
  options::options((options *)
                   &in.
                    super__Vector_base<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
                    ._M_impl.super__Vector_impl_data._M_end_of_storage);
  std::
  vector<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
  ::vector((vector<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
            *)local_48);
  pos._M_current._7_1_ = 1;
  local_60 = (basic_string<char,_std::char_traits<char>,_std::allocator<char>_> *)
             std::
             vector<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
             ::begin(args);
  local_58._M_current = local_60;
  do {
    local_68._M_current =
         (basic_string<char,_std::char_traits<char>,_std::allocator<char>_> *)
         std::
         vector<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
         ::end(args);
    bVar1 = __gnu_cxx::operator!=(&local_58,&local_68);
    if (!bVar1) {
      local_319 = 1;
      if ((in.
           super__Vector_base<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
           ._M_impl.super__Vector_impl_data._M_end_of_storage._6_1_ & 1) == 0) {
        local_319 = in.
                    super__Vector_base<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
                    ._M_impl.super__Vector_impl_data._M_end_of_storage._7_1_;
      }
      in.
      super__Vector_base<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
      ._M_impl.super__Vector_impl_data._M_end_of_storage._6_1_ = local_319 & 1;
      std::
      make_pair<lest::options&,std::vector<std::__cxx11::string,std::allocator<std::__cxx11::string>>&>
                (&local_2a8,
                 (options *)
                 &in.
                  super__Vector_base<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
                  ._M_impl.super__Vector_impl_data._M_end_of_storage,
                 (vector<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
                  *)local_48);
      std::
      pair<lest::options,_std::vector<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>_>
      ::pair(__return_storage_ptr__,&local_2a8);
      std::
      pair<lest::options,_std::vector<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>_>
      ::~pair(&local_2a8);
      local_14c = 1;
      std::
      vector<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
      ::~vector((vector<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
                 *)local_48);
      return __return_storage_ptr__;
    }
    std::__cxx11::string::string(local_88);
    std::__cxx11::string::string(local_a8);
    pbVar2 = __gnu_cxx::
             __normal_iterator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_*,_std::vector<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>_>
             ::operator*(&local_58);
    std::__cxx11::string::string(local_c8,(string *)pbVar2);
    std::__cxx11::string::string(local_138,local_c8);
    split_option(&local_118,(text *)local_138);
    std::tie<std::__cxx11::string,std::__cxx11::string>
              (local_148,
               (basic_string<char,_std::char_traits<char>,_std::allocator<char>_> *)local_88);
    std::tuple<std::__cxx11::string&,std::__cxx11::string&>::operator=
              ((tuple<std::__cxx11::string&,std::__cxx11::string&> *)local_148,&local_118);
    std::
    pair<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>
    ::~pair(&local_118);
    std::__cxx11::string::~string(local_138);
    if ((pos._M_current._7_1_ & 1) == 0) {
LAB_00109ea5:
      std::
      vector<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
      ::push_back((vector<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
                   *)local_48,(value_type *)local_c8);
      local_14c = 0;
    }
    else {
      pcVar3 = (char *)std::__cxx11::string::operator[]((ulong)local_88);
      if (*pcVar3 != '-') {
        pos._M_current._7_1_ = 0;
        goto LAB_00109ea5;
      }
      bVar1 = std::operator==((basic_string<char,_std::char_traits<char>,_std::allocator<char>_> *)
                              local_88,"--");
      if (bVar1) {
        pos._M_current._7_1_ = 0;
        local_14c = 4;
      }
      else {
        bVar1 = std::operator==((basic_string<char,_std::char_traits<char>,_std::allocator<char>_> *
                                )local_88,"-h");
        if ((bVar1) ||
           (bVar1 = std::operator==("--help",(basic_string<char,_std::char_traits<char>,_std::allocator<char>_>
                                              *)local_88), bVar1)) {
          in.
          super__Vector_base<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
          ._M_impl.super__Vector_impl_data._M_end_of_storage._0_1_ = 1;
          local_14c = 4;
        }
        else {
          bVar1 = std::operator==((basic_string<char,_std::char_traits<char>,_std::allocator<char>_>
                                   *)local_88,"-a");
          if ((bVar1) ||
             (bVar1 = std::operator==("--abort",
                                      (basic_string<char,_std::char_traits<char>,_std::allocator<char>_>
                                       *)local_88), bVar1)) {
            in.
            super__Vector_base<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
            ._M_impl.super__Vector_impl_data._M_end_of_storage._1_1_ = 1;
            local_14c = 4;
          }
          else {
            bVar1 = std::operator==((basic_string<char,_std::char_traits<char>,_std::allocator<char>_>
                                     *)local_88,"-c");
            if ((bVar1) ||
               (bVar1 = std::operator==("--count",
                                        (basic_string<char,_std::char_traits<char>,_std::allocator<char>_>
                                         *)local_88), bVar1)) {
              in.
              super__Vector_base<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
              ._M_impl.super__Vector_impl_data._M_end_of_storage._2_1_ = 1;
              local_14c = 4;
            }
            else {
              bVar1 = std::operator==((basic_string<char,_std::char_traits<char>,_std::allocator<char>_>
                                       *)local_88,"-g");
              if ((bVar1) ||
                 (bVar1 = std::operator==("--list-tags",
                                          (basic_string<char,_std::char_traits<char>,_std::allocator<char>_>
                                           *)local_88), bVar1)) {
                in.
                super__Vector_base<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
                ._M_impl.super__Vector_impl_data._M_end_of_storage._4_1_ = 1;
                local_14c = 4;
              }
              else {
                bVar1 = std::operator==((basic_string<char,_std::char_traits<char>,_std::allocator<char>_>
                                         *)local_88,"-l");
                if ((bVar1) ||
                   (bVar1 = std::operator==("--list-tests",
                                            (basic_string<char,_std::char_traits<char>,_std::allocator<char>_>
                                             *)local_88), bVar1)) {
                  in.
                  super__Vector_base<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
                  ._M_impl.super__Vector_impl_data._M_end_of_storage._3_1_ = 1;
                  local_14c = 4;
                }
                else {
                  bVar1 = std::operator==((basic_string<char,_std::char_traits<char>,_std::allocator<char>_>
                                           *)local_88,"-t");
                  if ((bVar1) ||
                     (bVar1 = std::operator==("--time",(
                                                  basic_string<char,_std::char_traits<char>,_std::allocator<char>_>
                                                  *)local_88), bVar1)) {
                    in.
                    super__Vector_base<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
                    ._M_impl.super__Vector_impl_data._M_end_of_storage._5_1_ = 1;
                    local_14c = 4;
                  }
                  else {
                    bVar1 = std::operator==((basic_string<char,_std::char_traits<char>,_std::allocator<char>_>
                                             *)local_88,"-p");
                    if ((bVar1) ||
                       (bVar1 = std::operator==("--pass",(
                                                  basic_string<char,_std::char_traits<char>,_std::allocator<char>_>
                                                  *)local_88), bVar1)) {
                      in.
                      super__Vector_base<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
                      ._M_impl.super__Vector_impl_data._M_end_of_storage._6_1_ = 1;
                      local_14c = 4;
                    }
                    else {
                      bVar1 = std::operator==((basic_string<char,_std::char_traits<char>,_std::allocator<char>_>
                                               *)local_88,"-z");
                      if ((bVar1) ||
                         (bVar1 = std::operator==("--pass-zen",
                                                  (
                                                  basic_string<char,_std::char_traits<char>,_std::allocator<char>_>
                                                  *)local_88), bVar1)) {
                        in.
                        super__Vector_base<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
                        ._M_impl.super__Vector_impl_data._M_end_of_storage._7_1_ = 1;
                        local_14c = 4;
                      }
                      else {
                        bVar1 = std::operator==((basic_string<char,_std::char_traits<char>,_std::allocator<char>_>
                                                 *)local_88,"-v");
                        if ((bVar1) ||
                           (bVar1 = std::operator==("--verbose",
                                                    (
                                                  basic_string<char,_std::char_traits<char>,_std::allocator<char>_>
                                                  *)local_88), bVar1)) {
                          local_14c = 4;
                        }
                        else {
                          bVar1 = std::operator==("--version",
                                                  (
                                                  basic_string<char,_std::char_traits<char>,_std::allocator<char>_>
                                                  *)local_88);
                          if (bVar1) {
                            local_14c = 4;
                          }
                          else {
                            bVar1 = std::operator==((
                                                  basic_string<char,_std::char_traits<char>,_std::allocator<char>_>
                                                  *)local_88,"--order");
                            if ((bVar1) &&
                               (bVar1 = std::operator==("declared",
                                                        (
                                                  basic_string<char,_std::char_traits<char>,_std::allocator<char>_>
                                                  *)local_a8), bVar1)) {
                              local_14c = 4;
                            }
                            else {
                              bVar1 = std::operator==((
                                                  basic_string<char,_std::char_traits<char>,_std::allocator<char>_>
                                                  *)local_88,"--order");
                              if ((bVar1) &&
                                 (bVar1 = std::operator==("lexical",
                                                          (
                                                  basic_string<char,_std::char_traits<char>,_std::allocator<char>_>
                                                  *)local_a8), bVar1)) {
                                local_14c = 4;
                              }
                              else {
                                bVar1 = std::operator==((
                                                  basic_string<char,_std::char_traits<char>,_std::allocator<char>_>
                                                  *)local_88,"--order");
                                if ((bVar1) &&
                                   (bVar1 = std::operator==("random",(
                                                  basic_string<char,_std::char_traits<char>,_std::allocator<char>_>
                                                  *)local_a8), bVar1)) {
                                  local_14c = 4;
                                }
                                else {
                                  bVar1 = std::operator==((
                                                  basic_string<char,_std::char_traits<char>,_std::allocator<char>_>
                                                  *)local_88,"--random-seed");
                                  if (bVar1) {
                                    std::allocator<char>::allocator();
                                    std::__cxx11::string::string
                                              (local_190,"--random-seed",&local_191);
                                    std::__cxx11::string::string(local_170,local_190);
                                    std::__cxx11::string::string(local_1b8,local_a8);
                                    seed((text *)local_170,(text *)local_1b8);
                                    std::__cxx11::string::~string(local_1b8);
                                    std::__cxx11::string::~string(local_170);
                                    std::__cxx11::string::~string(local_190);
                                    std::allocator<char>::~allocator((allocator<char> *)&local_191);
                                    local_14c = 4;
                                  }
                                  else {
                                    bVar1 = std::operator==((
                                                  basic_string<char,_std::char_traits<char>,_std::allocator<char>_>
                                                  *)local_88,"--repeat");
                                    if (!bVar1) {
                                      local_271 = 1;
                                      this = (runtime_error *)__cxa_allocate_exception(0x10);
                                      std::operator+(local_270,
                                                     (
                                                  basic_string<char,_std::char_traits<char>,_std::allocator<char>_>
                                                  *)"unrecognised option \'");
                                      std::operator+(local_250,local_270);
                                      std::runtime_error::runtime_error
                                                (local_230,(string *)local_250);
                                      std::runtime_error::runtime_error(this,local_230);
                                      local_271 = 0;
                                      __cxa_throw(this,&std::runtime_error::typeinfo,
                                                  std::runtime_error::~runtime_error);
                                    }
                                    std::allocator<char>::allocator();
                                    std::__cxx11::string::string(local_1f8,"--repeat",&local_1f9);
                                    std::__cxx11::string::string(local_1d8,local_1f8);
                                    std::__cxx11::string::string(local_220,local_a8);
                                    repeat((text *)local_1d8,(text *)local_220);
                                    std::__cxx11::string::~string(local_220);
                                    std::__cxx11::string::~string(local_1d8);
                                    std::__cxx11::string::~string(local_1f8);
                                    std::allocator<char>::~allocator((allocator<char> *)&local_1f9);
                                    local_14c = 4;
                                  }
                                }
                              }
                            }
                          }
                        }
                      }
                    }
                  }
                }
              }
            }
          }
        }
      }
    }
    std::__cxx11::string::~string(local_c8);
    std::__cxx11::string::~string(local_a8);
    std::__cxx11::string::~string(local_88);
    __gnu_cxx::
    __normal_iterator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_*,_std::vector<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>_>
    ::operator++(&local_58);
  } while( true );
}

Assistant:

inline std::pair<options, texts>
split_arguments( texts args )
{
    options option; texts in;

    bool in_options = true;

    for ( texts::iterator pos = args.begin(); pos != args.end() ; ++pos )
    {
        text opt, val, arg = *pos;
        tie( opt, val ) = split_option( arg );

        if ( in_options )
        {
            if      ( opt[0] != '-'                             ) { in_options     = false;           }
            else if ( opt == "--"                               ) { in_options     = false; continue; }
            else if ( opt == "-h"      || "--help"       == opt ) { option.help    =  true; continue; }
            else if ( opt == "-a"      || "--abort"      == opt ) { option.abort   =  true; continue; }
            else if ( opt == "-c"      || "--count"      == opt ) { option.count   =  true; continue; }
            else if ( opt == "-g"      || "--list-tags"  == opt ) { option.tags    =  true; continue; }
            else if ( opt == "-l"      || "--list-tests" == opt ) { option.list    =  true; continue; }
            else if ( opt == "-t"      || "--time"       == opt ) { option.time    =  true; continue; }
            else if ( opt == "-p"      || "--pass"       == opt ) { option.pass    =  true; continue; }
            else if ( opt == "-z"      || "--pass-zen"   == opt ) { option.zen     =  true; continue; }
            else if ( opt == "-v"      || "--verbose"    == opt ) { option.verbose =  true; continue; }
            else if (                     "--version"    == opt ) { option.version =  true; continue; }
            else if ( opt == "--order" && "declared"     == val ) { /* by definition */   ; continue; }
            else if ( opt == "--order" && "lexical"      == val ) { option.lexical =  true; continue; }
            else if ( opt == "--order" && "random"       == val ) { option.random  =  true; continue; }
            else if ( opt == "--random-seed" ) { option.seed   = seed  ( "--random-seed", val ); continue; }
            else if ( opt == "--repeat"      ) { option.repeat = repeat( "--repeat"     , val ); continue; }
            else throw std::runtime_error( "unrecognised option '" + opt + "' (try option --help)" );
        }
        in.push_back( arg );
    }
    option.pass = option.pass || option.zen;

    return std::make_pair( option, in );
}